

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::printAutotuneHelp(Args *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\nThe following arguments are for autotune:\n");
  poVar1 = std::operator<<(poVar1,
                           "  -autotune-validation            validation file to be used for evaluation\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  -autotune-metric                metric objective {f1, f1:labelname} ["
                          );
  poVar1 = std::operator<<(poVar1,(string *)&this->autotuneMetric);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -autotune-predictions           number of predictions used for evaluation  ["
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->autotunePredictions);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -autotune-duration              maximum duration in seconds [")
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->autotuneDuration);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -autotune-modelsize             constraint model file size [");
  poVar1 = std::operator<<(poVar1,(string *)&this->autotuneModelSize);
  std::operator<<(poVar1,"] (empty = do not quantize)\n");
  return;
}

Assistant:

void Args::printAutotuneHelp() {
  std::cerr << "\nThe following arguments are for autotune:\n"
            << "  -autotune-validation            validation file to be used "
               "for evaluation\n"
            << "  -autotune-metric                metric objective {f1, "
               "f1:labelname} ["
            << autotuneMetric << "]\n"
            << "  -autotune-predictions           number of predictions used "
               "for evaluation  ["
            << autotunePredictions << "]\n"
            << "  -autotune-duration              maximum duration in seconds ["
            << autotuneDuration << "]\n"
            << "  -autotune-modelsize             constraint model file size ["
            << autotuneModelSize << "] (empty = do not quantize)\n";
}